

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::insert_copy_after(xml_node *this,xml_node *proto,xml_node *node)

{
  bool bVar1;
  xml_node_type child;
  xml_node_type parent;
  xml_allocator *this_00;
  xml_node_struct *p;
  long *in_RDX;
  xml_node *in_RSI;
  xml_node *in_RDI;
  xml_node_struct *unaff_retaddr;
  xml_node n;
  xml_allocator *alloc;
  xml_node_type type_;
  xml_node local_38;
  undefined4 in_stack_ffffffffffffffd8;
  xml_node in_stack_fffffffffffffff8;
  
  child = type(in_RSI);
  parent = type(in_RDI);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,child);
  if (bVar1) {
    if ((*in_RDX == 0) || (*(xml_node_struct **)(*in_RDX + 0x18) != in_RDI->_root)) {
      xml_node((xml_node *)&stack0xfffffffffffffff8);
    }
    else {
      this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(in_RDI->_root);
      bVar1 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
      if (bVar1) {
        p = impl::anon_unknown_0::allocate_node
                      ((xml_allocator *)CONCAT44(child,in_stack_ffffffffffffffd8),
                       (xml_node_type)((ulong)this_00 >> 0x20));
        xml_node(&local_38,p);
        bVar1 = operator!(&local_38);
        if (bVar1) {
          xml_node((xml_node *)&stack0xfffffffffffffff8);
        }
        else {
          impl::anon_unknown_0::insert_node_after(local_38._root,(xml_node_struct *)*in_RDX);
          impl::anon_unknown_0::node_copy_tree(unaff_retaddr,in_stack_fffffffffffffff8._root);
          in_stack_fffffffffffffff8._root = local_38._root;
        }
      }
      else {
        xml_node((xml_node *)&stack0xfffffffffffffff8);
      }
    }
  }
  else {
    xml_node((xml_node *)&stack0xfffffffffffffff8);
  }
  return (xml_node)in_stack_fffffffffffffff8._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_copy_after(const xml_node& proto, const xml_node& node)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_after(n._root, node._root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}